

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

void Lpk_NodeCutsOne(Lpk_Man_t *p,Lpk_Cut_t *pCut,int Node)

{
  int *__dest;
  Vec_Ptr_t *pVVar1;
  Abc_Obj_t *p_00;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  Lpk_Cut_t *pCut_00;
  bool bVar12;
  
  if ((Node < 0) || (pVVar1 = p->pNtk->vObjs, pVVar1->nSize <= Node)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  p_00 = (Abc_Obj_t *)pVVar1->pArray[(uint)Node];
  uVar4 = *(uint *)&p_00->field_0x14 & 0xf;
  if ((uVar4 != 2) && (uVar4 != 5)) {
    if (uVar4 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                    ,0x1ef,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
    }
    iVar5 = Abc_NodeIsTravIdCurrent(p_00);
    if (iVar5 == 0) {
      uVar6 = *(uint *)pCut >> 0xc & 0x3f;
      uVar4 = p->pPars->nLutsOver;
      if (uVar6 == uVar4) {
        return;
      }
      if ((int)uVar4 <= (int)uVar6) {
        __assert_fail("(int)pCut->nNodesDup < p->pPars->nLutsOver",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x1f7,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
    }
    lVar8 = (long)(p_00->vFanins).nSize;
    if (0 < lVar8) {
      iVar5 = (*(uint *)pCut & 0x3f) - 1;
      lVar11 = 0;
      do {
        uVar4 = *(uint *)((long)p_00->pNtk->vObjs->pArray[(p_00->vFanins).pArray[lVar11]] + 0x10);
        if ((*(uint *)((long)pCut->uSign + (ulong)(uVar4 >> 3 & 4)) >> (uVar4 & 0x1f) & 1) == 0) {
          if (p->pPars->nVarsMax <= iVar5) {
            return;
          }
          iVar5 = iVar5 + 1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar8 != lVar11);
    }
    lVar8 = (long)p->nCuts;
    if (9999 < lVar8) {
      __assert_fail("p->nCuts < LPK_CUTS_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                    ,0x205,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
    }
    pCut_00 = p->pCuts + lVar8;
    *(byte *)pCut_00 = *(byte *)pCut_00 & 0xc0;
    if ((undefined1  [820])((undefined1  [820])*pCut & (undefined1  [820])0x3f) !=
        (undefined1  [820])0x0) {
      uVar9 = 0;
      do {
        iVar5 = pCut->pLeaves[uVar9];
        if (iVar5 != Node) {
          uVar4 = *(uint *)pCut_00;
          *(uint *)pCut_00 = uVar4 & 0xffffffc0 | uVar4 + 1 & 0x3f;
          p->pCuts[lVar8].pLeaves[uVar4 & 0x3f] = iVar5;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (*(uint *)pCut & 0x3f));
    }
    if (0 < (p_00->vFanins).nSize) {
      lVar11 = 0;
      do {
        pvVar2 = p_00->pNtk->vObjs->pArray[(p_00->vFanins).pArray[lVar11]];
        uVar6 = *(uint *)pCut_00 & 0x3f;
        bVar12 = uVar6 != 0;
        uVar4 = 0;
        if (uVar6 == 0) {
LAB_004e4d98:
          if (uVar6 == p->pPars->nVarsMax) {
            return;
          }
          if ((int)uVar4 < (int)uVar6) {
            uVar9 = (ulong)(*(uint *)pCut_00 & 0x3f);
            do {
              p->pCuts[lVar8].pLeaves[uVar9] = p->pCuts[lVar8].pLeaves[uVar9 - 1];
              uVar9 = uVar9 - 1;
            } while ((long)(int)uVar4 < (long)uVar9);
          }
          p->pCuts[lVar8].pLeaves[uVar4] = *(int *)((long)pvVar2 + 0x10);
          *(uint *)pCut_00 = *(uint *)pCut_00 & 0xffffffc0 | *(uint *)pCut_00 + 1 & 0x3f;
        }
        else {
          if (p->pCuts[lVar8].pLeaves[0] < *(int *)((long)pvVar2 + 0x10)) {
            uVar10 = 0;
            do {
              uVar4 = uVar6;
              if ((ulong)uVar6 - 1 == uVar10) goto LAB_004e4d98;
              uVar9 = uVar10 + 1;
              lVar3 = uVar10 + 1;
              uVar10 = uVar9;
            } while (p->pCuts[lVar8].pLeaves[lVar3] < *(int *)((long)pvVar2 + 0x10));
            bVar12 = uVar9 < uVar6;
          }
          else {
            uVar9 = 0;
          }
          uVar4 = (uint)uVar9;
          if ((!bVar12) ||
             (p->pCuts[lVar8].pLeaves[uVar9 & 0xffffffff] != *(int *)((long)pvVar2 + 0x10)))
          goto LAB_004e4d98;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (p_00->vFanins).nSize);
    }
    Lpk_NodeCutSignature(pCut_00);
    iVar5 = Lpk_NodeCutsOneFilter(p->pCuts,p->nCuts,pCut_00);
    if (iVar5 == 0) {
      __dest = p->pCuts[lVar8].pNodes;
      memcpy(__dest,pCut->pNodes,(ulong)(*(uint *)pCut >> 4 & 0xfc));
      uVar4 = *(uint *)pCut;
      uVar7 = uVar4 & 0xfc0;
      uVar6 = *(uint *)pCut_00;
      *(uint *)pCut_00 = uVar6 & 0xfffff03f | uVar7;
      *(uint *)pCut_00 = uVar6 & 0xfffc003f | uVar7 | *(uint *)pCut & 0x3f000;
      uVar4 = uVar4 >> 6 & 0x3f;
      if (uVar4 != 0) {
        uVar9 = 0;
LAB_004e4e6b:
        if (__dest[uVar9] != Node) goto code_r0x004e4e72;
        uVar4 = (uint)uVar9;
        uVar10 = uVar9;
        if ((int)uVar4 < (int)((*(uint *)pCut_00 >> 6 & 0x3f) - 1)) {
          do {
            uVar9 = uVar10 + 1;
            p->pCuts[lVar8].pNodes[uVar10] = p->pCuts[lVar8].pNodes[uVar10 + 1];
            uVar10 = uVar9;
          } while ((long)uVar9 < (long)(int)((*(uint *)pCut_00 >> 6 & 0x3f) - 1));
        }
        __dest[uVar9 & 0xffffffff] = Node;
        goto LAB_004e4ece;
      }
      uVar4 = 0;
LAB_004e4ece:
      uVar6 = *(uint *)pCut_00;
      uVar7 = uVar6 >> 6 & 0x3f;
      if (uVar4 == uVar7) {
        *(uint *)pCut_00 = uVar6 & 0xfffff03f | uVar6 + 0x40 & 0xfc0;
        p->pCuts[lVar8].pNodes[uVar7] = Node;
        uVar4 = Abc_NodeIsTravIdCurrent(p_00);
        *(uint *)pCut_00 =
             *(uint *)pCut_00 & 0xfffc0fff | (uVar4 ^ 1) * 0x1000 + *(uint *)pCut_00 & 0x3f000;
      }
      if ((int)((*(uint *)pCut_00 >> 0xc & 0x3f) + p->nMffc) < (int)(*(uint *)pCut_00 >> 6 & 0x3f))
      {
        __assert_fail("pCutNew->nNodes <= p->nMffc + pCutNew->nNodesDup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x23b,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      if (9999 < p->nCuts) {
        __assert_fail("p->nCuts < LPK_CUTS_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x23d,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      p->nCuts = p->nCuts + 1;
    }
  }
  return;
code_r0x004e4e72:
  uVar9 = uVar9 + 1;
  if (uVar4 == uVar9) goto LAB_004e4ece;
  goto LAB_004e4e6b;
}

Assistant:

void Lpk_NodeCutsOne( Lpk_Man_t * p, Lpk_Cut_t * pCut, int Node )
{
    Lpk_Cut_t * pCutNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, j, nLeavesNew;
/*
    printf( "Exploring cut " );
    Lpk_NodePrintCut( p, pCut, 1 );
    printf( "with node %d\n", Node );
*/
    // check if the cut can stand adding one more internal node
    if ( pCut->nNodes == LPK_SIZE_MAX )
        return;

    // if the node is a PI, quit
    pObj = Abc_NtkObj( p->pNtk, Node );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
//    assert( Abc_ObjFaninNum(pObj) <= p->pPars->nLutSize );

    // if the node is not in the MFFC, check the limit
    if ( !Abc_NodeIsTravIdCurrent(pObj) )
    {
        if ( (int)pCut->nNodesDup == p->pPars->nLutsOver )
            return;
        assert( (int)pCut->nNodesDup < p->pPars->nLutsOver );
    }

    // check the possibility of adding this node using the signature
    nLeavesNew = pCut->nLeaves - 1;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( (pCut->uSign[(pFanin->Id & 32) > 0] & (1 << (pFanin->Id & 31))) )
            continue;
        if ( ++nLeavesNew > p->pPars->nVarsMax )
            return;
    }

    // initialize the set of leaves to the nodes in the cut
    assert( p->nCuts < LPK_CUTS_MAX );
    pCutNew = p->pCuts + p->nCuts;
    pCutNew->nLeaves = 0;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] != Node )
            pCutNew->pLeaves[pCutNew->nLeaves++] = pCut->pLeaves[i];

    // add new nodes
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        // find the place where this node belongs
        for ( k = 0; k < (int)pCutNew->nLeaves; k++ )
            if ( pCutNew->pLeaves[k] >= pFanin->Id )
                break;
        if ( k < (int)pCutNew->nLeaves && pCutNew->pLeaves[k] == pFanin->Id )
            continue;
        // check if there is room
        if ( (int)pCutNew->nLeaves == p->pPars->nVarsMax )
            return;
        // move all the nodes
        for ( j = pCutNew->nLeaves; j > k; j-- )
            pCutNew->pLeaves[j] = pCutNew->pLeaves[j-1];
        pCutNew->pLeaves[k] = pFanin->Id;
        pCutNew->nLeaves++;
        assert( pCutNew->nLeaves <= LPK_SIZE_MAX );

    }
    // skip the contained cuts
    Lpk_NodeCutSignature( pCutNew );
    if ( Lpk_NodeCutsOneFilter( p->pCuts, p->nCuts, pCutNew ) )
        return;

    // update the set of internal nodes
    assert( pCut->nNodes < LPK_SIZE_MAX );
    memcpy( pCutNew->pNodes, pCut->pNodes, pCut->nNodes * sizeof(int) );
    pCutNew->nNodes = pCut->nNodes;
    pCutNew->nNodesDup = pCut->nNodesDup;

    // check if the node is already there
    // if so, move the node to be the last
    for ( i = 0; i < (int)pCutNew->nNodes; i++ )
        if ( pCutNew->pNodes[i] == Node )
        {
            for ( k = i; k < (int)pCutNew->nNodes - 1; k++ )
                pCutNew->pNodes[k] = pCutNew->pNodes[k+1];
            pCutNew->pNodes[k] = Node;
            break;
        }
    if ( i == (int)pCutNew->nNodes ) // new node
    {
        pCutNew->pNodes[ pCutNew->nNodes++ ] = Node;
        pCutNew->nNodesDup += !Abc_NodeIsTravIdCurrent(pObj);
    }
    // the number of nodes does not exceed MFFC plus duplications
    assert( pCutNew->nNodes <= p->nMffc + pCutNew->nNodesDup );
    // add the cut to storage
    assert( p->nCuts < LPK_CUTS_MAX );
    p->nCuts++;
}